

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void encode_longvarint(upb_encstate *e,uint64_t val)

{
  size_t __n;
  char *pcVar1;
  
  if ((ulong)((long)e->ptr - (long)e->buf) < 10) {
    encode_growbuffer(e,10);
    pcVar1 = e->ptr;
  }
  else {
    pcVar1 = e->ptr + -10;
    e->ptr = pcVar1;
  }
  __n = encode_varint64(val,pcVar1);
  pcVar1 = e->ptr + (10 - __n);
  memmove(pcVar1,e->ptr,__n);
  e->ptr = pcVar1;
  return;
}

Assistant:

UPB_NOINLINE
static void encode_longvarint(upb_encstate* e, uint64_t val) {
  size_t len;
  char* start;

  encode_reserve(e, UPB_PB_VARINT_MAX_LEN);
  len = encode_varint64(val, e->ptr);
  start = e->ptr + UPB_PB_VARINT_MAX_LEN - len;
  memmove(start, e->ptr, len);
  e->ptr = start;
}